

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O1

uint32 crnlib::get_ogl_base_internal_fmt(uint32 ogl_fmt)

{
  ulong uVar1;
  uint uVar2;
  
  if ((int)ogl_fmt < 0x83f1) {
    if ((int)ogl_fmt < 0x8058) {
      if ((int)ogl_fmt < 0x1903) {
        switch(ogl_fmt) {
        case 1:
switchD_0019c1dd_caseD_1903:
          return 0x1903;
        case 2:
switchD_0019c1dd_caseD_190a:
          return 0x8227;
        case 3:
          return 0x1907;
        case 4:
          goto switchD_0019c1dd_caseD_1907;
        default:
          goto switchD_0019c2d1_default;
        }
      }
      switch(ogl_fmt) {
      case 0x1903:
      case 0x1904:
      case 0x1905:
      case 0x1906:
      case 0x1909:
        goto switchD_0019c1dd_caseD_1903;
      case 0x1907:
        return 0x1907;
      case 0x1908:
        goto switchD_0019c1dd_caseD_1907;
      case 0x190a:
        goto switchD_0019c1dd_caseD_190a;
      default:
        if (ogl_fmt == 0x8040) {
          return 0x1903;
        }
        if (ogl_fmt != 0x8051) {
          return 0;
        }
        return 0x1907;
      }
    }
    if ((int)ogl_fmt < 0x83a0) {
      if (0x8226 < (int)ogl_fmt) {
        uVar2 = ogl_fmt - 0x8227;
        if (0xb < uVar2) {
          return 0;
        }
        if ((0x13U >> (uVar2 & 0x1f) & 1) != 0) {
          return 0x8227;
        }
        if ((0x804U >> (uVar2 & 0x1f) & 1) != 0) {
          return 0x1903;
        }
        return 0;
      }
      if (ogl_fmt != 0x8058) {
        if (ogl_fmt == 0x80e0) {
          return 0x1907;
        }
        if (ogl_fmt != 0x80e1) {
          return 0;
        }
      }
    }
    else if (3 < ogl_fmt - 0x83a2) {
      if (ogl_fmt - 0x83a0 < 2) {
        return 0x1907;
      }
      if (ogl_fmt == 0x83f0) {
        return 0x1907;
      }
      return 0;
    }
  }
  else if ((int)ogl_fmt < 0x8d64) {
    if (0x8c4b < (int)ogl_fmt) {
      uVar1 = (ulong)(ogl_fmt - 0x8c4d);
      if (ogl_fmt - 0x8c4d < 0x27) {
        if ((7UL >> (uVar1 & 0x3f) & 1) != 0) {
          return 0x1908;
        }
        if ((0x1800000000U >> (uVar1 & 0x3f) & 1) != 0) {
          return 0x1903;
        }
        if ((0x6000000000U >> (uVar1 & 0x3f) & 1) != 0) {
          return 0x8227;
        }
      }
      if (ogl_fmt == 0x8c4c) {
        return 0x1907;
      }
switchD_0019c2d1_default:
      return 0;
    }
    if (2 < ogl_fmt - 0x83f1) {
      if (ogl_fmt - 0x8c40 < 2) {
        return 0x1907;
      }
      if (1 < ogl_fmt - 0x8c42) {
        return 0;
      }
    }
  }
  else if ((int)ogl_fmt < 0x8dbb) {
    uVar1 = (ulong)(ogl_fmt - 0x8d64);
    if (0x37 < ogl_fmt - 0x8d64) {
      return 0;
    }
    if ((0x7000000000000U >> (uVar1 & 0x3f) & 1) != 0) {
      return 0x1903;
    }
    if ((0x50000000000001U >> (uVar1 & 0x3f) & 1) != 0) {
      return 0x1907;
    }
    if ((0xa0000000000000U >> (uVar1 & 0x3f) & 1) == 0) {
      return 0;
    }
  }
  else {
    if ((int)ogl_fmt < 0x9274) {
      if (ogl_fmt - 0x8dbb < 2) {
        return 0x1903;
      }
      if (ogl_fmt - 0x8dbd < 2) {
        return 0x8227;
      }
      return 0;
    }
    if (ogl_fmt == 0x9274) {
      return 0x1907;
    }
    if (ogl_fmt != 0x9278) {
      return 0;
    }
  }
switchD_0019c1dd_caseD_1907:
  return 0x1908;
}

Assistant:

uint32 get_ogl_base_internal_fmt(uint32 ogl_fmt) {
  switch (ogl_fmt) {
    case KTX_ETC1_RGB8_OES:
    case KTX_COMPRESSED_RGB8_ETC2:
    case KTX_RGB_S3TC:
    case KTX_RGB4_S3TC:
    case KTX_COMPRESSED_RGB_S3TC_DXT1_EXT:
    case KTX_COMPRESSED_SRGB_S3TC_DXT1_EXT:
      return KTX_RGB;
    case KTX_COMPRESSED_RGBA8_ETC2_EAC:
    case KTX_COMPRESSED_RGBA_S3TC_DXT1_EXT:
    case KTX_COMPRESSED_SRGB_ALPHA_S3TC_DXT1_EXT:
    case KTX_RGBA_S3TC:
    case KTX_RGBA4_S3TC:
    case KTX_COMPRESSED_RGBA_S3TC_DXT3_EXT:
    case KTX_COMPRESSED_SRGB_ALPHA_S3TC_DXT3_EXT:
    case KTX_COMPRESSED_RGBA_S3TC_DXT5_EXT:
    case KTX_COMPRESSED_SRGB_ALPHA_S3TC_DXT5_EXT:
    case KTX_RGBA_DXT5_S3TC:
    case KTX_RGBA4_DXT5_S3TC:
      return KTX_RGBA;
    case 1:
    case KTX_RED:
    case KTX_RED_INTEGER:
    case KTX_GREEN:
    case KTX_GREEN_INTEGER:
    case KTX_BLUE:
    case KTX_BLUE_INTEGER:
    case KTX_R8:
    case KTX_R8UI:
    case KTX_LUMINANCE8:
    case KTX_ALPHA:
    case KTX_LUMINANCE:
    case KTX_COMPRESSED_RED_RGTC1_EXT:
    case KTX_COMPRESSED_SIGNED_RED_RGTC1_EXT:
    case KTX_COMPRESSED_LUMINANCE_LATC1_EXT:
    case KTX_COMPRESSED_SIGNED_LUMINANCE_LATC1_EXT:
      return KTX_RED;
    case 2:
    case KTX_RG:
    case KTX_RG8:
    case KTX_RG_INTEGER:
    case KTX_LUMINANCE_ALPHA:
    case KTX_COMPRESSED_RED_GREEN_RGTC2_EXT:
    case KTX_COMPRESSED_SIGNED_RED_GREEN_RGTC2_EXT:
    case KTX_COMPRESSED_LUMINANCE_ALPHA_LATC2_EXT:
    case KTX_COMPRESSED_SIGNED_LUMINANCE_ALPHA_LATC2_EXT:
      return KTX_RG;
    case 3:
    case KTX_SRGB:
    case KTX_RGB:
    case KTX_RGB_INTEGER:
    case KTX_BGR:
    case KTX_BGR_INTEGER:
    case KTX_RGB8:
    case KTX_SRGB8:
      return KTX_RGB;
    case 4:
    case KTX_RGBA:
    case KTX_BGRA:
    case KTX_RGBA_INTEGER:
    case KTX_BGRA_INTEGER:
    case KTX_SRGB_ALPHA:
    case KTX_SRGB8_ALPHA8:
    case KTX_RGBA8:
      return KTX_RGBA;
  }
  return 0;
}